

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gls::BindInactiveAliasingAttributeTest::iterate(BindInactiveAliasingAttributeTest *this)

{
  undefined1 *this_00;
  deInt32 dVar1;
  undefined4 extraout_var;
  long *plVar2;
  size_type *psVar3;
  int iVar4;
  deUint32 dVar5;
  int iVar6;
  string local_318;
  long *local_2f8 [2];
  long local_2e8 [2];
  int local_2d4;
  BindInactiveAliasingAttributeTest *local_2d0;
  undefined8 local_2c8;
  AttribType *local_2c0;
  long *local_2b8;
  long local_2b0;
  long local_2a8 [2];
  Attribute local_298;
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  bindings;
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  attributes;
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  noBindings;
  ostringstream s;
  
  noBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  noBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  noBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dVar1 = anon_unknown_1::getMaxAttributeLocations(this->m_renderCtx);
  local_2c8 = CONCAT44(extraout_var,dVar1);
  local_2d4 = 1;
  if (this->m_arraySize != -1) {
    local_2d4 = this->m_arraySize;
  }
  attributes.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  attributes.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  attributes.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  this_00 = &s.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"GL_MAX_VERTEX_ATTRIBS: ",0x17);
  std::ostream::operator<<(this_00,(int)local_2c8);
  tcu::MessageBuilder::operator<<((MessageBuilder *)&s,(EndMessageToken *)&tcu::TestLog::EndMessage)
  ;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  std::ios_base::~ios_base
            ((ios_base *)&s.super_basic_ostream<char,_std::char_traits<char>_>.field_0x78);
  dVar5 = (int)local_2c8 - (this->m_type).m_locationSize * local_2d4;
  local_2d0 = this;
  if (-1 < (int)dVar5) {
    local_2c0 = &this->m_type;
    iVar4 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
      std::ostream::operator<<((Cond *)&s,iVar4);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
      std::ios_base::~ios_base
                ((ios_base *)&s.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
      plVar2 = (long *)std::__cxx11::string::replace((ulong)local_2f8,0,(char *)0x0,0x1cfb4b0);
      local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
      psVar3 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar3) {
        local_318.field_2._M_allocated_capacity = *psVar3;
        local_318.field_2._8_8_ = plVar2[3];
      }
      else {
        local_318.field_2._M_allocated_capacity = *psVar3;
        local_318._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_318._M_string_length = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      local_2b8 = local_2a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"A","");
      s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)
           CONCAT71(s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream._1_7_,1
                   );
      s.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
           &s.super_basic_ostream<char,_std::char_traits<char>_>.field_0x18;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&s.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8,local_2b8
                 ,local_2b0 + (long)local_2b8);
      AttributeLocationTestUtil::Attribute::Attribute
                (&local_298,local_2c0,&local_318,-1,(Cond *)&s,-1);
      std::
      vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
      ::emplace_back<deqp::gls::AttributeLocationTestUtil::Attribute>(&attributes,&local_298);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298.m_cond.m_name._M_dataplus._M_p != &local_298.m_cond.m_name.field_2) {
        operator_delete(local_298.m_cond.m_name._M_dataplus._M_p,
                        local_298.m_cond.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298.m_name._M_dataplus._M_p != &local_298.m_name.field_2) {
        operator_delete(local_298.m_name._M_dataplus._M_p,
                        local_298.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298.m_type.m_name._M_dataplus._M_p != &local_298.m_type.m_name.field_2) {
        operator_delete(local_298.m_type.m_name._M_dataplus._M_p,
                        local_298.m_type.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)s.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ !=
          &s.super_basic_ostream<char,_std::char_traits<char>_>.field_0x18) {
        operator_delete((void *)s.super_basic_ostream<char,_std::char_traits<char>_>._8_8_,
                        s.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ + 1);
      }
      if (local_2b8 != local_2a8) {
        operator_delete(local_2b8,local_2a8[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_dataplus._M_p != &local_318.field_2) {
        operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
      }
      if (local_2f8[0] != local_2e8) {
        operator_delete(local_2f8[0],local_2e8[0] + 1);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
      std::ostream::operator<<((Cond *)&s,iVar4);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
      std::ios_base::~ios_base
                ((ios_base *)&s.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
      plVar2 = (long *)std::__cxx11::string::replace((ulong)local_2f8,0,(char *)0x0,0x1cfb4b0);
      local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
      psVar3 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar3) {
        local_318.field_2._M_allocated_capacity = *psVar3;
        local_318.field_2._8_8_ = plVar2[3];
      }
      else {
        local_318.field_2._M_allocated_capacity = *psVar3;
        local_318._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_318._M_string_length = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      local_298.m_type.m_name._M_dataplus._M_p = (pointer)&local_298.m_type.m_name.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_298,local_318._M_dataplus._M_p,
                 local_318._M_dataplus._M_p + local_318._M_string_length);
      local_298.m_type.m_locationSize = dVar5;
      std::
      vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
      ::emplace_back<deqp::gls::AttributeLocationTestUtil::Bind>(&bindings,(Bind *)&local_298);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298.m_type.m_name._M_dataplus._M_p != &local_298.m_type.m_name.field_2) {
        operator_delete(local_298.m_type.m_name._M_dataplus._M_p,
                        local_298.m_type.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_dataplus._M_p != &local_318.field_2) {
        operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
      }
      if (local_2f8[0] != local_2e8) {
        operator_delete(local_2f8[0],local_2e8[0] + 1);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
      iVar6 = (int)local_2c8 + iVar4;
      std::ostream::operator<<((Cond *)&s,iVar6);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
      std::ios_base::~ios_base
                ((ios_base *)&s.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
      plVar2 = (long *)std::__cxx11::string::replace((ulong)local_2f8,0,(char *)0x0,0x1cfb4b0);
      local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
      psVar3 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar3) {
        local_318.field_2._M_allocated_capacity = *psVar3;
        local_318.field_2._8_8_ = plVar2[3];
      }
      else {
        local_318.field_2._M_allocated_capacity = *psVar3;
        local_318._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_318._M_string_length = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)
           ((ulong)s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream &
           0xffffffffffffff00);
      s.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
           &s.super_basic_ostream<char,_std::char_traits<char>_>.field_0x18;
      s.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = 0x737961776c615f5f;
      s.super_basic_ostream<char,_std::char_traits<char>_>._32_2_ = 0x5f5f;
      s.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = 10;
      s.super_basic_ostream<char,_std::char_traits<char>_>._34_1_ = 0;
      AttributeLocationTestUtil::Attribute::Attribute
                (&local_298,local_2c0,&local_318,-1,(Cond *)&s,-1);
      std::
      vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
      ::emplace_back<deqp::gls::AttributeLocationTestUtil::Attribute>(&attributes,&local_298);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298.m_cond.m_name._M_dataplus._M_p != &local_298.m_cond.m_name.field_2) {
        operator_delete(local_298.m_cond.m_name._M_dataplus._M_p,
                        local_298.m_cond.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298.m_name._M_dataplus._M_p != &local_298.m_name.field_2) {
        operator_delete(local_298.m_name._M_dataplus._M_p,
                        local_298.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298.m_type.m_name._M_dataplus._M_p != &local_298.m_type.m_name.field_2) {
        operator_delete(local_298.m_type.m_name._M_dataplus._M_p,
                        local_298.m_type.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)s.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ !=
          &s.super_basic_ostream<char,_std::char_traits<char>_>.field_0x18) {
        operator_delete((void *)s.super_basic_ostream<char,_std::char_traits<char>_>._8_8_,
                        s.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_dataplus._M_p != &local_318.field_2) {
        operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
      }
      if (local_2f8[0] != local_2e8) {
        operator_delete(local_2f8[0],local_2e8[0] + 1);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
      std::ostream::operator<<((Cond *)&s,iVar6);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
      std::ios_base::~ios_base
                ((ios_base *)&s.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
      plVar2 = (long *)std::__cxx11::string::replace((ulong)local_2f8,0,(char *)0x0,0x1cfb4b0);
      local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
      psVar3 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar3) {
        local_318.field_2._M_allocated_capacity = *psVar3;
        local_318.field_2._8_8_ = plVar2[3];
      }
      else {
        local_318.field_2._M_allocated_capacity = *psVar3;
        local_318._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_318._M_string_length = plVar2[1];
      *plVar2 = (long)psVar3;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      local_298.m_type.m_name._M_dataplus._M_p = (pointer)&local_298.m_type.m_name.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_298,local_318._M_dataplus._M_p,
                 local_318._M_dataplus._M_p + local_318._M_string_length);
      local_298.m_type.m_locationSize = dVar5;
      std::
      vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
      ::emplace_back<deqp::gls::AttributeLocationTestUtil::Bind>(&bindings,(Bind *)&local_298);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298.m_type.m_name._M_dataplus._M_p != &local_298.m_type.m_name.field_2) {
        operator_delete(local_298.m_type.m_name._M_dataplus._M_p,
                        local_298.m_type.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_dataplus._M_p != &local_318.field_2) {
        operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
      }
      if (local_2f8[0] != local_2e8) {
        operator_delete(local_2f8[0],local_2e8[0] + 1);
      }
      iVar4 = iVar4 + 1;
      dVar5 = dVar5 - (local_2d0->m_type).m_locationSize * local_2d4;
    } while (-1 < (int)dVar5);
  }
  s.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream = (_func_int **)0x0;
  s.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0;
  s.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = 0;
  AttributeLocationTestUtil::runTest
            ((local_2d0->super_TestCase).super_TestNode.m_testCtx,local_2d0->m_renderCtx,&attributes
             ,&noBindings,&bindings,&noBindings,false,false,
             (vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
              *)&s);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::~vector((vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
             *)&s);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::~vector(&bindings);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::~vector(&attributes);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::~vector(&noBindings);
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult BindInactiveAliasingAttributeTest::iterate (void)
{
	const vector<Bind>	noBindings;
	const deInt32		maxAttributes		= getMaxAttributeLocations(m_renderCtx);
	const int			arrayElementCount	= (m_arraySize != Attribute::NOT_ARRAY ? m_arraySize : 1);

	vector<Attribute>	attributes;
	vector<Bind>		bindings;
	int					ndx = 0;

	m_testCtx.getLog() << TestLog::Message << "GL_MAX_VERTEX_ATTRIBS: " << maxAttributes << TestLog::EndMessage;

	for (int loc = maxAttributes - arrayElementCount * m_type.getLocationSize(); loc >= 0; loc -= m_type.getLocationSize() * arrayElementCount)
	{
		attributes.push_back(Attribute(m_type, "a_" + de::toString(ndx), Attribute::LOC_UNDEF, Cond("A")));
		bindings.push_back(Bind("a_" + de::toString(ndx), loc));

		attributes.push_back(Attribute(m_type, "a_" + de::toString(ndx + maxAttributes), Attribute::LOC_UNDEF, Cond::COND_NEVER));
		bindings.push_back(Bind("a_" + de::toString(ndx + maxAttributes), loc));
		ndx++;
	}

	runTest(m_testCtx, m_renderCtx, attributes, noBindings, bindings, noBindings, false);
	return STOP;
}